

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

string * google::protobuf::compiler::objectivec::TextFormatDecodeData::DecodeDataForString
                   (string *__return_storage_ptr__,string *input_for_decode,string *desired_output)

{
  char desired;
  long lVar1;
  long *plVar2;
  ostream *poVar3;
  size_type *psVar4;
  char cVar5;
  char input;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  undefined1 local_80 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string *local_58;
  string local_50;
  
  if ((input_for_decode->_M_string_length == 0) || (desired_output->_M_string_length == 0)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "error: got empty string for making TextFormat data, input: \"");
    poVar3 = std::operator<<(poVar3,(string *)input_for_decode);
    poVar3 = std::operator<<(poVar3,"\", desired: \"");
    poVar3 = std::operator<<(poVar3,(string *)desired_output);
    poVar3 = std::operator<<(poVar3,"\".");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    lVar1 = std::__cxx11::string::find((char)input_for_decode,0);
    if ((lVar1 == -1) && (lVar1 = std::__cxx11::string::find((char)desired_output,0), lVar1 == -1))
    {
      local_80._8_8_ = &local_68;
      local_80._16_8_ = 0;
      uVar7 = 0;
      local_68._M_local_buf[0] = '\0';
      local_80[0] = (string)0x0;
      local_80[1] = true;
      local_80[2] = '\0';
      local_80._4_4_ = 0;
      if (desired_output->_M_string_length != 0) {
        uVar8 = 0;
        local_58 = __return_storage_ptr__;
        do {
          desired = (desired_output->_M_dataplus)._M_p[uVar8];
          if (desired == '_') {
            anon_unknown_0::DecodeDataBuilder::Push((DecodeDataBuilder *)local_80);
            local_80[0] = (string)0x1;
          }
          else {
            iVar6 = (int)uVar7;
            if (input_for_decode->_M_string_length <= (ulong)(long)iVar6) {
LAB_0027043a:
              __return_storage_ptr__ = local_58;
              anon_unknown_0::DirectDecodeString(local_58,desired_output);
              goto LAB_0027047e;
            }
            input = (input_for_decode->_M_dataplus)._M_p[iVar6];
            if (local_80._4_4_ == 0x1f) {
              anon_unknown_0::DecodeDataBuilder::Push((DecodeDataBuilder *)local_80);
            }
            if (local_80._4_4_ == 0) {
LAB_00270385:
              bVar9 = anon_unknown_0::DecodeDataBuilder::AddFirst
                                ((DecodeDataBuilder *)local_80,desired,input);
              if (!bVar9) goto LAB_0027043a;
            }
            else {
              if (desired == input) {
                bVar9 = (byte)(desired + 0xbfU) < 0x1a;
                if ((!bVar9) && (local_80[2] == '`')) {
                  anon_unknown_0::DecodeDataBuilder::Push((DecodeDataBuilder *)local_80);
                  input = desired;
                  goto LAB_00270385;
                }
              }
              else {
                cVar5 = input + -0x20;
                if (0x19 < (byte)(input + 0x9fU)) {
                  cVar5 = input;
                }
                if ((cVar5 != desired) || (local_80[1] != true)) {
                  anon_unknown_0::DecodeDataBuilder::Push((DecodeDataBuilder *)local_80);
                  goto LAB_00270385;
                }
                local_80[2] = '`';
                bVar9 = (byte)(desired + 0xbfU) < 0x1a;
              }
              local_80._4_4_ = local_80._4_4_ + 1;
              local_80[1] = (bool)(local_80[1] & bVar9);
            }
            uVar7 = (ulong)(iVar6 + 1);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < desired_output->_M_string_length);
        uVar7 = (ulong)(int)uVar7;
        __return_storage_ptr__ = local_58;
      }
      if (input_for_decode->_M_string_length == uVar7) {
        anon_unknown_0::DecodeDataBuilder::Push((DecodeDataBuilder *)local_80);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_80._8_8_,(char *)(local_80._8_8_ + local_80._16_8_));
        plVar2 = (long *)std::__cxx11::string::_M_replace_aux
                                   ((ulong)&local_50,local_50._M_string_length,0,'\x01');
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar4 = (size_type *)(plVar2 + 2);
        if ((size_type *)*plVar2 == psVar4) {
          lVar1 = plVar2[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
        }
        __return_storage_ptr__->_M_string_length = plVar2[1];
        *plVar2 = (long)psVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      else {
        anon_unknown_0::DirectDecodeString(__return_storage_ptr__,desired_output);
      }
LAB_0027047e:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._8_8_ != &local_68) {
        operator_delete((void *)local_80._8_8_);
      }
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "error: got a null char in a string for making TextFormat data,",0x3e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," input: \"",9);
    CEscape((string *)local_80,input_for_decode);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,
                        (char *)CONCAT44(local_80._4_4_,
                                         CONCAT13(local_80[3],
                                                  CONCAT12(local_80[2],
                                                           CONCAT11(local_80[1],local_80[0])))),
                        local_80._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\", desired: \"",0xd);
    CEscape(&local_50,desired_output);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\".",2);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)local_80);
  }
  std::ostream::flush();
  abort();
}

Assistant:

std::string TextFormatDecodeData::DecodeDataForString(
    const std::string& input_for_decode, const std::string& desired_output) {
  if (input_for_decode.empty() || desired_output.empty()) {
    std::cerr << "error: got empty string for making TextFormat data, input: \""
         << input_for_decode << "\", desired: \"" << desired_output << "\"."
         << std::endl;
    std::cerr.flush();
    abort();
  }
  if ((input_for_decode.find('\0') != std::string::npos) ||
      (desired_output.find('\0') != std::string::npos)) {
    std::cerr << "error: got a null char in a string for making TextFormat data,"
         << " input: \"" << CEscape(input_for_decode) << "\", desired: \""
         << CEscape(desired_output) << "\"." << std::endl;
    std::cerr.flush();
    abort();
  }

  DecodeDataBuilder builder;

  // Walk the output building it from the input.
  int x = 0;
  for (int y = 0; y < desired_output.size(); y++) {
    const char d = desired_output[y];
    if (d == '_') {
      builder.AddUnderscore();
      continue;
    }

    if (x >= input_for_decode.size()) {
      // Out of input, no way to encode it, just return a full decode.
      return DirectDecodeString(desired_output);
    }
    if (builder.AddCharacter(d, input_for_decode[x])) {
      ++x;  // Consumed one input
    } else {
      // Couldn't transform for the next character, just return a full decode.
      return DirectDecodeString(desired_output);
    }
  }

  if (x != input_for_decode.size()) {
    // Extra input (suffix from name sanitizing?), just return a full decode.
    return DirectDecodeString(desired_output);
  }

  // Add the end marker.
  return builder.Finish() + (char)'\0';
}